

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall slang::ast::Scope::elaborate(Scope *this)

{
  string_view *key;
  SymbolKind SVar1;
  SyntaxKind SVar2;
  ClassType *this_00;
  Compilation *pCVar3;
  ExpressionSyntax *pEVar4;
  pointer this_01;
  Symbol *pSVar5;
  ForwardingTypedefSymbol *pFVar6;
  SymbolMap *pSVar7;
  GenericClassDefSymbol *this_02;
  undefined1 auVar8 [16];
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  portDeclarations;
  Compilation **ppCVar9;
  undefined1 auVar10 [8];
  undefined8 uVar11;
  pointer ppSVar12;
  int iVar13;
  SymbolIndex SVar14;
  DeferredMemberData *pDVar15;
  DeclaredType *this_03;
  Type *pTVar16;
  TransparentMemberSymbol *pTVar17;
  EnumTypeSyntax *syntax;
  GenerateBlockSyntax *syntax_00;
  GenerateBlockSymbol *member;
  BindDirectiveSyntax *syntax_01;
  IfGenerateSyntax *syntax_02;
  ClockingItemSyntax *syntax_03;
  ModportDeclarationSyntax *syntax_04;
  PortSymbol *this_04;
  undefined4 extraout_var;
  Scope *extraout_RAX;
  Scope *pSVar18;
  DefaultClockingReferenceSyntax *syntax_05;
  DefaultDisableDeclarationSyntax *pDVar19;
  undefined4 extraout_var_00;
  Type *pTVar20;
  PrimitiveInstantiationSyntax *syntax_06;
  HierarchyInstantiationSyntax *syntax_07;
  CaseGenerateSyntax *syntax_08;
  LoopGenerateSyntax *syntax_09;
  GenerateBlockArraySymbol *member_00;
  ContinuousAssignSyntax *syntax_10;
  ModuleDeclarationSyntax *syntax_11;
  PortDeclarationSyntax *pPVar21;
  DataDeclarationSyntax *pDVar22;
  DeclaratorSyntax *this_05;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *pSVar23;
  Symbol *pSVar24;
  iterator iVar25;
  Diagnostic *pDVar26;
  logic_error *this_06;
  long *plVar27;
  size_type *psVar28;
  SyntaxNode *pSVar29;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  Symbol *extraout_RDX_03;
  Symbol *pSVar31;
  Symbol *pSVar32;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range4;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> args;
  pointer ppSVar33;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *this_07;
  long lVar34;
  Symbol *pSVar35;
  Symbol **ppSVar36;
  TransparentMemberSymbol *pTVar37;
  size_t index;
  long lVar38;
  Scope *pSVar39;
  ulong uVar40;
  pointer ppFVar41;
  pointer ppVar42;
  pointer ppSVar43;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB_00;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
  pVar44;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_> iVar45;
  LookupLocation LVar46;
  string_view sVar47;
  SourceRange sourceRange;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar48;
  SmallVector<const_slang::ast::Symbol_*,_5UL> ports;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
  observedForwardDecls;
  Symbol *at;
  DeferredMemberData deferredData;
  SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  enumDecls;
  undefined4 uVar49;
  uint32_t constructIndex;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 uVar50;
  undefined1 local_2e8 [8];
  Symbol *local_2e0;
  undefined1 local_2d8 [16];
  TempVarSymbol *local_2c8;
  Symbol *pSStack_2c0;
  AssertionInstanceDetails *local_2b8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  Scope SStack_290;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
  *local_248;
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
  local_240;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *local_218;
  char *local_210;
  ulong local_208;
  undefined1 local_200 [56];
  SyntaxNode *local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  DeferredMemberData local_180;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Scope *local_e0 [16];
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
  *local_60;
  sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  local_58;
  Expression *expr;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar30;
  
  if ((this->thisSym->kind == InstanceBody) && (TimeTrace::profiler != 0)) {
    detail.callable = (intptr_t)local_e0;
    detail.callback =
         function_ref<std::__cxx11::string()>::callback_fn<slang::ast::Scope::elaborate()const::__2>
    ;
    sVar47._M_str = "elaborate scope";
    sVar47._M_len = 0xf;
    local_e0[0] = this;
    TimeTrace::beginTrace(sVar47,detail);
  }
  if (this->deferredMemberIndex == Invalid) {
    assert::assertFailed
              ("deferredMemberIndex != DeferredMemberIndex::Invalid",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
               ,0x326,"void slang::ast::Scope::elaborate() const");
  }
  local_1c8 = (SyntaxNode *)&this->deferredMemberIndex;
  pDVar15 = Compilation::getOrAddDeferredData(this->compilation,(DeferredMemberIndex *)local_1c8);
  DeferredMemberData::DeferredMemberData(&local_180,pDVar15);
  this->deferredMemberIndex = Invalid;
  local_60 = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
              *)local_e0;
  local_58.
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>.
  storage = local_60;
  local_58.entries = ska::detailv3::empty_default_table<slang::syntax::SyntaxNode_const*>();
  local_58.num_slots_minus_one = 0;
  local_58.hash_policy.shift = '?';
  local_58.max_lookups = '\x03';
  local_58._max_load_factor = 0.5;
  local_58.num_elements = 0;
  if (local_180.transparentTypes.
      super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.transparentTypes.
      super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar49 = 0x4026b6;
    in_stack_fffffffffffffd04 = 0;
    ppVar42 = local_180.transparentTypes.
              super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pTVar37 = (TransparentMemberSymbol *)ppVar42->first;
      this_03 = Symbol::getDeclaredType(ppVar42->second);
      pTVar16 = DeclaredType::getType(this_03);
      while( true ) {
        pTVar20 = pTVar16->canonical;
        if (pTVar20 == (Type *)0x0) {
          Type::resolveCanonical(pTVar16);
          pTVar20 = pTVar16->canonical;
        }
        if ((pTVar20->super_Symbol).kind != PackedArrayType) break;
        pTVar16 = Type::getArrayElementType(pTVar16);
      }
      SVar1 = (pTVar16->super_Symbol).kind;
      if (SVar1 == EnumType) {
        pSVar18 = (Scope *)(pTVar16->super_Symbol).originatingSyntax;
        if ((pSVar18 == (Scope *)0x0) ||
           (local_2a8._0_8_ = pSVar18,
           pVar44 = ska::detailv3::
                    sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                    ::emplace<slang::syntax::SyntaxNode_const*>
                              ((sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                                *)&local_58,(SyntaxNode **)local_2a8),
           ((undefined1  [16])pVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          if ((pTVar16->super_Symbol).kind != EnumType) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                       ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::EnumType]");
          }
          iVar45 = membersOfType<slang::ast::EnumValueSymbol>
                             ((Scope *)&pTVar16[1].super_Symbol.name);
          sVar30 = iVar45.m_end.current;
LAB_0028349c:
          args = iVar45.m_begin.current;
          if (args.current != sVar30.current) {
            if ((((ValueSymbol *)&(args.current)->kind)->super_Symbol).kind != EnumValue) {
              assert::assertFailed
                        ("T::isKind(kind)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                         ,0xc4,
                         "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::EnumValueSymbol]"
                        );
            }
            pSVar18 = this;
            pTVar17 = BumpAllocator::
                      emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol_const&>
                                (&this->compilation->super_BumpAllocator,
                                 (EnumValueSymbol *)args.current);
            insertMember(this,&pTVar17->super_Symbol,&pTVar37->super_Symbol,true,false);
            do {
              args.current = (((EnumValueSymbol *)args.current)->super_ValueSymbol).super_Symbol.
                             nextInScope;
              iVar45.m_end.current = extraout_RDX.current;
              iVar45.m_begin.current = args.current;
              pTVar37 = pTVar17;
              this = pSVar18;
              if ((EnumValueSymbol *)args.current == (EnumValueSymbol *)0x0) {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = extraout_RDX.current;
                iVar45 = (iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                          )(auVar8 << 0x40);
                break;
              }
            } while ((((ValueSymbol *)&(args.current)->kind)->super_Symbol).kind != EnumValue);
            goto LAB_0028349c;
          }
        }
      }
      else {
        iVar13 = 0x341;
        if ((*(int *)&this_03->field_0x3c < 0) ||
           ((SyntaxNode *)(this_03->typeOrLink).typeSyntax == (SyntaxNode *)0x0)) {
          uVar49 = 0x3f3432;
          in_stack_fffffffffffffd04 = 0;
LAB_00284450:
          assert::assertFailed
                    ((char *)CONCAT44(in_stack_fffffffffffffd04,uVar49),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                     ,iVar13,"void slang::ast::Scope::elaborate() const");
        }
        if (SVar1 != ErrorType) {
          iVar13 = 0x342;
          goto LAB_00284450;
        }
        local_2a8._0_8_ = &SStack_290;
        local_2a8._8_8_ = 0;
        local_298 = (undefined1  [8])0x5;
        local_2e0 = (Symbol *)CONCAT44(local_2e0._4_4_,0xffffffff);
        local_2b8 = (AssertionInstanceDetails *)0x0;
        local_2c8 = (TempVarSymbol *)0x0;
        pSStack_2c0 = (Symbol *)0x0;
        local_2d8._0_8_ = 0;
        local_2d8[8] = '\0';
        local_2d8[9] = '\0';
        local_2d8[10] = '\0';
        local_2d8[0xb] = '\0';
        local_2d8[0xc] = '\0';
        local_2d8[0xd] = '\0';
        local_2d8[0xe] = '\0';
        local_2d8[0xf] = '\0';
        local_2e8 = (undefined1  [8])this;
        syntax = slang::syntax::SyntaxNode::as<slang::syntax::EnumTypeSyntax>
                           ((SyntaxNode *)(this_03->typeOrLink).typeSyntax);
        EnumType::createDefaultMembers
                  ((ASTContext *)local_2e8,syntax,
                   (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2a8);
        uVar11 = local_2a8._0_8_;
        if (local_2a8._8_8_ != 0) {
          lVar38 = local_2a8._8_8_ << 3;
          lVar34 = 0;
          do {
            pTVar17 = *(TransparentMemberSymbol **)((long)(Compilation **)uVar11 + lVar34);
            insertMember(this,&pTVar17->super_Symbol,&pTVar37->super_Symbol,true,false);
            lVar34 = lVar34 + 8;
            pTVar37 = pTVar17;
          } while (lVar38 != lVar34);
        }
        if ((Scope *)local_2a8._0_8_ != &SStack_290) {
          free((void *)local_2a8._0_8_);
        }
      }
      ppVar42 = ppVar42 + 1;
    } while (ppVar42 !=
             local_180.transparentTypes.
             super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppSVar12 = local_180.members.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  this_00 = (ClassType *)this->thisSym;
  SVar1 = (this_00->super_Type).super_Symbol.kind;
  pSVar18 = this;
  if (SVar1 == InstanceBody) {
    if (*(int *)&(this_00->baseConstructorCall).
                 super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
                 super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value[1]
                 .field_0x4 == 1) {
      deferredMembers.size_ =
           (long)local_180.members.
                 super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.members.
                 super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      deferredMembers.data_ =
           local_180.members.
           super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      handleExportedMethods(this,deferredMembers);
    }
  }
  else if (SVar1 == ClassType) {
    insertCB.callable = (intptr_t)local_2a8;
    insertCB.callback =
         function_ref<void(slang::ast::Symbol_const&)>::
         callback_fn<slang::ast::Scope::elaborate()const::__3>;
    local_2a8._0_8_ = this;
    ClassType::inheritMembers(this_00,insertCB);
  }
  if (ppSVar12 !=
      local_180.members.
      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    constructIndex = 1;
    local_210 = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
    local_208 = 0;
    local_218 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)0x0
    ;
    ppSVar43 = ppSVar12;
    this = pSVar18;
    do {
      pSVar24 = *ppSVar43;
      LVar46 = LookupLocation::before(pSVar24);
      local_200._8_4_ = LVar46.index;
      local_200._32_8_ = (TempVarSymbol *)0x0;
      local_200._40_8_ = (Symbol *)0x0;
      local_200._16_8_ = 0;
      local_200._24_8_ = (SourceLocation)0x0;
      local_200._48_8_ = (AssertionInstanceDetails *)0x0;
      local_200._0_8_ = this;
      if (LVar46.scope != this && LVar46.scope != (Scope *)0x0) {
        assert::assertFailed
                  ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                   ,0x119,
                   "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                  );
      }
      if (pSVar24->kind != DeferredMember) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = (anonymous namespace)::DeferredMemberSymbol]"
                  );
      }
      pSVar29 = *(SyntaxNode **)(pSVar24 + 1);
      SVar2 = pSVar29->kind;
      if ((int)SVar2 < 0xd5) {
        if ((int)SVar2 < 0x65) {
          if (0x39 < (int)SVar2) {
            if (SVar2 == CaseGenerate) {
              local_2a8._8_8_ = 0;
              local_298 = (undefined1  [8])0x5;
              pCVar3 = this->compilation;
              local_2a8._0_8_ = &SStack_290;
              syntax_08 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(pSVar29);
              GenerateBlockSymbol::fromSyntax
                        (pCVar3,syntax_08,(ASTContext *)local_200,constructIndex,true,
                         (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)local_2a8);
              uVar11 = local_2a8._0_8_;
              pSVar24->indexInScope = pSVar24->indexInScope - (int)local_2a8._8_8_;
              if (local_2a8._8_8_ != 0) {
                lVar38 = local_2a8._8_8_ << 3;
                lVar34 = 0;
                do {
                  pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar34);
                  insertMember(this,pSVar35,pSVar24,true,true);
                  lVar34 = lVar34 + 8;
                  pSVar24 = pSVar35;
                } while (lVar38 != lVar34);
              }
LAB_00283e94:
              if ((Scope *)local_2a8._0_8_ != &SStack_290) {
                free((void *)local_2a8._0_8_);
              }
              goto LAB_00283ee6;
            }
            if (SVar2 != ClockingItem) goto LAB_002844f4;
            local_2a8._8_8_ = 0;
            local_298 = (undefined1  [8])0x5;
            local_2a8._0_8_ = &SStack_290;
            syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::ClockingItemSyntax>(pSVar29);
            ClockVarSymbol::fromSyntax
                      (this,syntax_03,
                       (SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *)local_2a8);
            uVar11 = local_2a8._0_8_;
            pSVar24->indexInScope = pSVar24->indexInScope - (int)local_2a8._8_8_;
            if (local_2a8._8_8_ != 0) {
              lVar38 = local_2a8._8_8_ << 3;
              lVar34 = 0;
              do {
                pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar34);
                insertMember(this,pSVar35,pSVar24,true,true);
                lVar34 = lVar34 + 8;
                pSVar24 = pSVar35;
              } while (lVar38 != lVar34);
            }
            goto LAB_00283a28;
          }
          if (SVar2 == AnsiPortList) {
LAB_00283a4f:
            local_2e8 = (undefined1  [8])(local_2d8 + 8);
            local_2e0 = (Symbol *)0x0;
            local_2d8._0_8_ = 5;
            local_2a8._8_8_ = 0;
            local_298 = (undefined1  [8])0x4;
            local_2a8._0_8_ = &SStack_290;
            this_04 = (PortSymbol *)
                      slang::syntax::SyntaxNode::as<slang::syntax::PortListSyntax>(pSVar29);
            portDeclarations.size_._0_4_ = constructIndex;
            portDeclarations.data_ = (pointer)this;
            portDeclarations.size_._4_4_ = in_stack_fffffffffffffd04;
            PortSymbol::fromSyntax
                      (this_04,(PortListSyntax *)this,(Scope *)local_2e8,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2a8,
                       (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                        *)local_180.portDecls.
                          super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,portDeclarations);
            auVar10 = local_2e8;
            pSVar24->indexInScope = pSVar24->indexInScope - (int)local_2e0;
            src = extraout_RDX_00;
            pSVar18 = this;
            if (local_2e0 != (Symbol *)0x0) {
              lVar38 = (long)local_2e0 << 3;
              lVar34 = 0;
              do {
                pSVar35 = *(Symbol **)((long)(Compilation **)auVar10 + lVar34);
                insertMember(pSVar18,pSVar35,pSVar24,true,true);
                lVar34 = lVar34 + 8;
                src = extraout_RDX_01;
                pSVar24 = pSVar35;
              } while (lVar38 != lVar34);
            }
            this = pSVar18;
            if (local_2a8._8_8_ != 0) {
              ppCVar9 = (Compilation **)local_2a8._0_8_;
              lVar34 = local_2a8._8_8_ * 2;
              pSVar39 = (Scope *)local_2a8._0_8_;
              do {
                insertMember(pSVar18,(Symbol *)pSVar39->compilation,pSVar39->thisSym,true,false);
                pSVar39 = (Scope *)&pSVar39->nameMap;
                src = extraout_RDX_02;
              } while (pSVar39 != (Scope *)(ppCVar9 + lVar34));
            }
            pSVar24 = pSVar18->thisSym;
            if (pSVar24->kind != InstanceBody) {
              assert::assertFailed
                        ("T::isKind(kind)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                         ,0xc4,
                         "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::InstanceBodySymbol]"
                        );
            }
            iVar13 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                               ((SmallVectorBase<const_slang::ast::Symbol_*> *)local_2e8,
                                (EVP_PKEY_CTX *)pSVar18->compilation,src);
            pSVar24[2].parentScope = (Scope *)CONCAT44(extraout_var,iVar13);
            pSVar24[2].nextInScope = extraout_RDX_03;
            if ((Scope *)local_2a8._0_8_ != &SStack_290) {
              free((void *)local_2a8._0_8_);
            }
            pSVar18 = (Scope *)(local_2d8 + 8);
            if (local_2e8 != (undefined1  [8])pSVar18) {
              free((void *)local_2e8);
              pSVar18 = extraout_RAX;
            }
            local_208 = CONCAT71((int7)((ulong)pSVar18 >> 8),1);
          }
          else {
            if (SVar2 != BindDirective) {
LAB_002844f4:
              this_06 = (logic_error *)__cxa_allocate_exception(0x10);
              local_1c0[0] = local_1b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                         ,"");
              plVar27 = (long *)std::__cxx11::string::append((char *)local_1c0);
              local_1a0._M_dataplus._M_p = (pointer)*plVar27;
              psVar28 = (size_type *)(plVar27 + 2);
              if ((size_type *)local_1a0._M_dataplus._M_p == psVar28) {
                local_1a0.field_2._M_allocated_capacity = *psVar28;
                local_1a0.field_2._8_8_ = plVar27[3];
                local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar28;
              }
              local_1a0._M_string_length = plVar27[1];
              *plVar27 = (long)psVar28;
              plVar27[1] = 0;
              *(undefined1 *)(plVar27 + 2) = 0;
              std::__cxx11::to_string(&local_120,0x400);
              std::operator+(&local_100,&local_1a0,&local_120);
              plVar27 = (long *)std::__cxx11::string::append((char *)&local_100);
              local_2e8 = (undefined1  [8])*plVar27;
              pSVar18 = (Scope *)(plVar27 + 2);
              if (local_2e8 == (undefined1  [8])pSVar18) {
                local_2d8._0_8_ = pSVar18->compilation;
                local_2d8._8_8_ = *(char (*) [8])(plVar27 + 3);
                local_2e8 = (undefined1  [8])local_2d8;
              }
              else {
                local_2d8._0_8_ = pSVar18->compilation;
              }
              local_2e0 = (Symbol *)plVar27[1];
              *plVar27 = (long)pSVar18;
              plVar27[1] = 0;
              *(undefined1 *)(plVar27 + 2) = 0;
              plVar27 = (long *)std::__cxx11::string::append(local_2e8);
              local_2a8._0_8_ = *plVar27;
              pSVar29 = (SyntaxNode *)(plVar27 + 2);
              if ((SyntaxNode *)local_2a8._0_8_ == pSVar29) {
                local_298 = (undefined1  [8])pSVar29->parent;
                SStack_290.compilation = *(Compilation **)(plVar27 + 3);
                local_2a8._0_8_ = (SyntaxNode *)local_298;
              }
              else {
                local_298 = (undefined1  [8])pSVar29->parent;
              }
              local_2a8._8_8_ = plVar27[1];
              *plVar27 = (long)pSVar29;
              plVar27[1] = 0;
              *(undefined1 *)(plVar27 + 2) = 0;
              std::logic_error::logic_error(this_06,(string *)local_2a8);
              __cxa_throw(this_06,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::BindDirectiveSyntax>(pSVar29);
            InstanceSymbol::fromBindDirective(this,syntax_01);
          }
        }
        else if ((int)SVar2 < 0x78) {
          if (SVar2 == ContinuousAssign) {
            local_2a8._8_8_ = 0;
            local_298 = (undefined1  [8])0x5;
            local_2e8 = (undefined1  [8])(local_2d8 + 8);
            local_2e0 = (Symbol *)0x0;
            local_2d8._0_8_ = 5;
            pCVar3 = this->compilation;
            local_2a8._0_8_ = &SStack_290;
            syntax_10 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>
                                  (pSVar29);
            ContinuousAssignSymbol::fromSyntax
                      (pCVar3,syntax_10,(ASTContext *)local_200,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2a8,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2e8);
            auVar10 = local_2e8;
            SVar14 = ~(uint)local_2a8._8_8_ + pSVar24->indexInScope;
            pSVar24->indexInScope = SVar14;
            if (local_2e0 != (Symbol *)0x0) {
              lVar38 = (long)local_2e0 << 3;
              lVar34 = 0;
              pSVar35 = pSVar24;
              do {
                pSVar24 = *(Symbol **)((long)(Compilation **)auVar10 + lVar34);
                insertMember(this,pSVar24,pSVar35,true,false);
                lVar34 = lVar34 + 8;
                pSVar35 = pSVar24;
              } while (lVar38 != lVar34);
              SVar14 = pSVar24->indexInScope;
            }
            uVar11 = local_2a8._0_8_;
            pSVar24->indexInScope = SVar14 + 1;
            if (local_2a8._8_8_ != 0) {
              lVar34 = local_2a8._8_8_ * 8;
              lVar38 = 0;
              do {
                pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar38);
                insertMember(this,pSVar35,pSVar24,true,true);
                lVar38 = lVar38 + 8;
                pSVar24 = pSVar35;
              } while (lVar34 != lVar38);
            }
            goto LAB_00283fd6;
          }
          if (SVar2 != DataDeclaration) goto LAB_002844f4;
          local_2a8._8_8_ = 0;
          local_298 = (undefined1  [8])0x5;
          local_2a8._0_8_ = &SStack_290;
          pDVar22 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(pSVar29);
          tryFixupInstances(this,pDVar22,(ASTContext *)local_200,
                            (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2a8);
          uVar11 = local_2a8._0_8_;
          pSVar24->indexInScope = pSVar24->indexInScope - (int)local_2a8._8_8_;
          if (local_2a8._8_8_ != 0) {
            lVar38 = local_2a8._8_8_ << 3;
            lVar34 = 0;
            do {
              pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar34);
              insertMember(this,pSVar35,pSVar24,true,true);
              lVar34 = lVar34 + 8;
              pSVar24 = pSVar35;
            } while (lVar38 != lVar34);
          }
LAB_00283a28:
          if ((Scope *)local_2a8._0_8_ != &SStack_290) {
LAB_00283ff9:
            free((void *)local_2a8._0_8_);
          }
        }
        else if (SVar2 == DefaultClockingReference) {
          pCVar3 = this->compilation;
          syntax_05 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultClockingReferenceSyntax>
                                (pSVar29);
          Compilation::noteDefaultClocking(pCVar3,(ASTContext *)local_200,syntax_05);
        }
        else {
          if (SVar2 != DefaultDisableDeclaration) {
            if (SVar2 != GenerateBlock) goto LAB_002844f4;
            syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(pSVar29);
            member = GenerateBlockSymbol::fromSyntax(this,syntax_00,constructIndex);
            insertMember(this,&member->super_Symbol,pSVar24,true,true);
            goto LAB_00283ee6;
          }
          pDVar19 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultDisableDeclarationSyntax>
                              (pSVar29);
          pEVar4 = (pDVar19->expr).ptr;
          if (pEVar4 == (ExpressionSyntax *)0x0) {
LAB_002844d4:
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,local_210);
          }
          iVar13 = Expression::bind((int)pEVar4,(sockaddr *)local_200,0);
          expr = (Expression *)CONCAT44(extraout_var_00,iVar13);
          pTVar16 = (expr->type).ptr;
          if (pTVar16 == (Type *)0x0) {
            local_210 = 
            "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
            ;
            goto LAB_002844d4;
          }
          pTVar20 = pTVar16->canonical;
          if (pTVar20 == (Type *)0x0) {
            Type::resolveCanonical(pTVar16);
            pTVar20 = pTVar16->canonical;
          }
          if ((pTVar20->super_Symbol).kind != VoidType) {
            ASTContext::requireBooleanConvertible((ASTContext *)local_200,expr);
          }
          Compilation::noteDefaultDisable(this->compilation,this,expr);
        }
      }
      else if ((int)SVar2 < 0x122) {
        if ((int)SVar2 < 0x10d) {
          if (SVar2 != HierarchyInstantiation) {
            if (SVar2 != IfGenerate) goto LAB_002844f4;
            local_2a8._8_8_ = 0;
            local_298 = (undefined1  [8])0x5;
            pCVar3 = this->compilation;
            local_2a8._0_8_ = &SStack_290;
            syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(pSVar29);
            GenerateBlockSymbol::fromSyntax
                      (pCVar3,syntax_02,(ASTContext *)local_200,constructIndex,true,
                       (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)local_2a8);
            uVar11 = local_2a8._0_8_;
            pSVar24->indexInScope = pSVar24->indexInScope - (int)local_2a8._8_8_;
            if (local_2a8._8_8_ != 0) {
              lVar38 = local_2a8._8_8_ << 3;
              lVar34 = 0;
              do {
                pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar34);
                insertMember(this,pSVar35,pSVar24,true,true);
                lVar34 = lVar34 + 8;
                pSVar24 = pSVar35;
              } while (lVar38 != lVar34);
            }
            goto LAB_00283e94;
          }
          local_2a8._8_8_ = 0;
          local_298 = (undefined1  [8])0x5;
          local_2e8 = (undefined1  [8])(local_2d8 + 8);
          local_2e0 = (Symbol *)0x0;
          local_2d8._0_8_ = 5;
          pCVar3 = this->compilation;
          local_2a8._0_8_ = &SStack_290;
          syntax_07 = slang::syntax::SyntaxNode::as<slang::syntax::HierarchyInstantiationSyntax>
                                (pSVar29);
          InstanceSymbol::fromSyntax
                    (pCVar3,syntax_07,(ASTContext *)local_200,
                     (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2a8,
                     (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2e8);
          auVar10 = local_2e8;
          SVar14 = ~(uint)local_2a8._8_8_ + pSVar24->indexInScope;
          pSVar24->indexInScope = SVar14;
          if (local_2e0 != (Symbol *)0x0) {
            lVar38 = (long)local_2e0 << 3;
            lVar34 = 0;
            pSVar35 = pSVar24;
            do {
              pSVar24 = *(Symbol **)((long)(Compilation **)auVar10 + lVar34);
              insertMember(this,pSVar24,pSVar35,true,false);
              lVar34 = lVar34 + 8;
              pSVar35 = pSVar24;
            } while (lVar38 != lVar34);
            SVar14 = pSVar24->indexInScope;
          }
          uVar11 = local_2a8._0_8_;
          pSVar24->indexInScope = SVar14 + 1;
          if (local_2a8._8_8_ != 0) {
            lVar34 = local_2a8._8_8_ * 8;
            lVar38 = 0;
            do {
              pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar38);
              insertMember(this,pSVar35,pSVar24,true,true);
              lVar38 = lVar38 + 8;
              pSVar24 = pSVar35;
            } while (lVar34 != lVar38);
          }
LAB_00283fd6:
          if (local_2e8 != (undefined1  [8])(local_2d8 + 8)) {
            free((void *)local_2e8);
          }
          if ((Scope *)local_2a8._0_8_ != &SStack_290) goto LAB_00283ff9;
        }
        else {
          if (SVar2 != LoopGenerate) {
            if (SVar2 != ModportDeclaration) goto LAB_002844f4;
            local_2a8._8_8_ = 0;
            local_298 = (undefined1  [8])0x5;
            local_2a8._0_8_ = &SStack_290;
            syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                                  (pSVar29);
            ModportSymbol::fromSyntax
                      ((ASTContext *)local_200,syntax_04,
                       (SmallVectorBase<const_slang::ast::ModportSymbol_*> *)local_2a8);
            uVar11 = local_2a8._0_8_;
            pSVar24->indexInScope = pSVar24->indexInScope - (int)local_2a8._8_8_;
            if (local_2a8._8_8_ != 0) {
              lVar38 = local_2a8._8_8_ << 3;
              lVar34 = 0;
              do {
                pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar34);
                insertMember(this,pSVar35,pSVar24,true,true);
                lVar34 = lVar34 + 8;
                pSVar24 = pSVar35;
              } while (lVar38 != lVar34);
            }
            goto LAB_00283a28;
          }
          pCVar3 = this->compilation;
          syntax_09 = slang::syntax::SyntaxNode::as<slang::syntax::LoopGenerateSyntax>(pSVar29);
          member_00 = GenerateBlockArraySymbol::fromSyntax
                                (pCVar3,syntax_09,pSVar24->indexInScope,(ASTContext *)local_200,
                                 constructIndex);
          insertMember(this,&member_00->super_Symbol,pSVar24,true,true);
LAB_00283ee6:
          constructIndex = constructIndex + 1;
        }
      }
      else {
        if ((int)SVar2 < 0x15d) {
          if (SVar2 != ModuleDeclaration) {
            if (SVar2 != NonAnsiPortList) goto LAB_002844f4;
            goto LAB_00283a4f;
          }
        }
        else {
          if (SVar2 == PortDeclaration) goto LAB_00283ffe;
          if (SVar2 == PrimitiveInstantiation) {
            local_2a8._8_8_ = 0;
            local_298 = (undefined1  [8])0x5;
            local_2e8 = (undefined1  [8])(local_2d8 + 8);
            local_2e0 = (Symbol *)0x0;
            local_2d8._0_8_ = 5;
            local_2a8._0_8_ = &SStack_290;
            syntax_06 = slang::syntax::SyntaxNode::as<slang::syntax::PrimitiveInstantiationSyntax>
                                  (pSVar29);
            PrimitiveInstanceSymbol::fromSyntax
                      (syntax_06,(ASTContext *)local_200,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2a8,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2e8);
            auVar10 = local_2e8;
            SVar14 = ~(uint)local_2a8._8_8_ + pSVar24->indexInScope;
            pSVar24->indexInScope = SVar14;
            if (local_2e0 != (Symbol *)0x0) {
              lVar38 = (long)local_2e0 << 3;
              lVar34 = 0;
              pSVar35 = pSVar24;
              do {
                pSVar24 = *(Symbol **)((long)(Compilation **)auVar10 + lVar34);
                insertMember(this,pSVar24,pSVar35,true,false);
                lVar34 = lVar34 + 8;
                pSVar35 = pSVar24;
              } while (lVar38 != lVar34);
              SVar14 = pSVar24->indexInScope;
            }
            uVar11 = local_2a8._0_8_;
            pSVar24->indexInScope = SVar14 + 1;
            if (local_2a8._8_8_ != 0) {
              lVar34 = local_2a8._8_8_ * 8;
              lVar38 = 0;
              do {
                pSVar35 = *(Symbol **)((long)(Compilation **)uVar11 + lVar38);
                insertMember(this,pSVar35,pSVar24,true,true);
                lVar38 = lVar38 + 8;
                pSVar24 = pSVar35;
              } while (lVar34 != lVar38);
            }
            goto LAB_00283fd6;
          }
          if (SVar2 != ProgramDeclaration) goto LAB_002844f4;
        }
        local_218 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *
                    )CONCAT71((uint7)(uint3)(SVar2 >> 8),1);
      }
LAB_00283ffe:
      ppSVar43 = ppSVar43 + 1;
    } while (ppSVar43 !=
             local_180.members.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
    ppSVar33 = ppSVar12;
    pSVar18 = this;
    if (((byte)local_218 &
        ppSVar12 !=
        local_180.members.
        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
        super__Vector_impl_data._M_finish) == 1) {
      do {
        if ((*ppSVar33)->kind != DeferredMember) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,
                     "decltype(auto) slang::ast::Symbol::as() [T = (anonymous namespace)::DeferredMemberSymbol]"
                    );
        }
        pSVar29 = *(SyntaxNode **)(*ppSVar33 + 1);
        SVar2 = pSVar29->kind;
        if ((SVar2 == ProgramDeclaration) || (SVar2 == ModuleDeclaration)) {
          syntax_11 = slang::syntax::SyntaxNode::as<slang::syntax::ModuleDeclarationSyntax>(pSVar29)
          ;
          handleNestedDefinition(this,syntax_11);
        }
        ppSVar33 = ppSVar33 + 1;
      } while (ppSVar33 !=
               local_180.members.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((local_208 & 1) != 0) goto LAB_0028414c;
  }
  local_218 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
              local_180.portDecls.
              super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pSVar23 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
            local_180.portDecls.
            super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_180.portDecls.
      super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.portDecls.
      super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar49 = SUB84(pSVar23,0);
      uVar50 = (undefined4)((ulong)pSVar23 >> 0x20);
      this_01 = pSVar23->data_;
      if (*(SyntaxKind *)&this_01->second == PortDeclaration) {
        pPVar21 = slang::syntax::SyntaxNode::as<slang::syntax::PortDeclarationSyntax>
                            ((SyntaxNode *)this_01);
        this_07 = &pPVar21->declarators;
        this = pSVar18;
      }
      else {
        pDVar22 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>
                            ((SyntaxNode *)this_01);
        this_07 = &pDVar22->declarators;
        this = pSVar18;
      }
      uVar40 = (this_07->elements).size_ + 1;
      if (1 < uVar40) {
        index = 0;
        do {
          this_05 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::operator[]
                              (this_07,index);
          sVar47 = parsing::Token::valueText(&this_05->name);
          if (sVar47._M_len != 0) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange(&this_05->super_SyntaxNode);
            pDVar26 = addDiag(this,(DiagCode)0x990006,sourceRange);
            Diagnostic::operator<<(pDVar26,sVar47);
            break;
          }
          index = index + 1;
        } while (uVar40 >> 1 != index);
      }
      pSVar23 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                (CONCAT44(uVar50,uVar49) + 0x10);
      pSVar18 = this;
    } while (pSVar23 != local_218);
  }
LAB_0028414c:
  if ((ppSVar12 !=
       local_180.members.
       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pSVar24 = this->firstMember, pSVar24 != (Symbol *)0x0)
     ) {
    pSVar35 = this->lastMember;
    pSVar31 = (Symbol *)0x0;
    do {
      pSVar32 = pSVar24;
      if (pSVar24->kind == DeferredMember) {
        pSVar5 = pSVar24->nextInScope;
        ppSVar36 = &pSVar31->nextInScope;
        if (pSVar31 == (Symbol *)0x0) {
          ppSVar36 = &this->firstMember;
        }
        *ppSVar36 = pSVar5;
        pSVar32 = pSVar31;
        if (pSVar35 == pSVar24) {
          this->lastMember = pSVar5;
          pSVar35 = pSVar5;
        }
      }
      pSVar24 = pSVar24->nextInScope;
      pSVar31 = pSVar32;
    } while (pSVar24 != (Symbol *)0x0);
  }
  local_248 = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               *)local_2a8;
  local_240.
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
  .storage = local_248;
  local_240.entries =
       ska::detailv3::empty_default_table<std::basic_string_view<char,std::char_traits<char>>>();
  local_240.num_slots_minus_one = 0;
  local_240.hash_policy.shift = '?';
  local_240.max_lookups = '\x03';
  local_240._max_load_factor = 0.5;
  local_240.num_elements = 0;
  for (ppFVar41 = local_180.forwardingTypedefs.
                  super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppFVar41 !=
      local_180.forwardingTypedefs.
      super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppFVar41 = ppFVar41 + 1) {
    pFVar6 = *ppFVar41;
    if ((pFVar6->super_Symbol).name._M_len != 0) {
      key = &(pFVar6->super_Symbol).name;
      pVar48 = ska::detailv3::
               sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>>
               ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
                         ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>>
                           *)&local_240,key);
      if (((undefined1  [16])pVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        iVar25 = ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                 ::find(&pSVar18->nameMap->
                         super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                        ,key);
        pSVar7 = pSVar18->nameMap;
        if (iVar25.current ==
            (pSVar7->
            super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
            ).entries +
            (pSVar7->
            super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
            ).num_slots_minus_one +
            (long)(pSVar7->
                  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                  ).max_lookups) {
          assert::assertFailed
                    ("it != nameMap->end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                     ,0x442,"void slang::ast::Scope::elaborate() const");
        }
        this_02 = (GenericClassDefSymbol *)((iVar25.current)->field_1).value.second;
        SVar1 = (this_02->super_Symbol).kind;
        if (SVar1 == ClassType) {
          ClassType::checkForwardDecls((ClassType *)this_02);
        }
        else if (SVar1 == GenericClassDef) {
          GenericClassDefSymbol::checkForwardDecls(this_02);
        }
        else if (SVar1 == TypeAlias) {
          TypeAliasType::checkForwardDecls((TypeAliasType *)this_02);
        }
        else {
          pDVar26 = addDiag(pSVar18,(DiagCode)0x37000a,(pFVar6->super_Symbol).location);
          Diagnostic::operator<<(pDVar26,(pFVar6->super_Symbol).name);
        }
      }
    }
  }
  if ((((StatementBlockSymbol *)pSVar18->thisSym)->super_Symbol).kind == StatementBlock) {
    local_2e0 = (Symbol *)local_200;
    local_200._0_8_ = (Scope *)0x0;
    insertCB_00.callable = (intptr_t)local_2e8;
    insertCB_00.callback =
         function_ref<void(slang::ast::Symbol_const&)>::
         callback_fn<slang::ast::Scope::elaborate()const::__4>;
    local_2e8 = (undefined1  [8])pSVar18;
    StatementBlockSymbol::elaborateVariables((StatementBlockSymbol *)pSVar18->thisSym,insertCB_00);
  }
  if (*(DeferredMemberIndex *)&local_1c8->parent == Invalid) {
    if ((pSVar18->thisSym->kind == InstanceBody) && (TimeTrace::profiler != 0)) {
      TimeTrace::endTrace();
    }
    ska::detailv3::
    sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
    ::~sherwood_v3_table(&local_240);
    ska::detailv3::
    sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
    ::~sherwood_v3_table(&local_58);
    if ((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
        local_180.portDecls.
        super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)0x0) {
      operator_delete(local_180.portDecls.
                      super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.portDecls.
                            super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.portDecls.
                            super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_180.forwardingTypedefs.
        super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.forwardingTypedefs.
                      super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.forwardingTypedefs.
                            super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.forwardingTypedefs.
                            super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_180.transparentTypes.
        super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.transparentTypes.
                      super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.transparentTypes.
                            super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.transparentTypes.
                            super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_180.members.
        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.members.
                      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.members.
                            super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.members.
                            super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  assert::assertFailed
            ("deferredMemberIndex == DeferredMemberIndex::Invalid",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
             ,0x458,"void slang::ast::Scope::elaborate() const");
}

Assistant:

void Scope::elaborate() const {
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled()) {
        TimeTrace::beginTrace("elaborate scope"sv, [&] {
            std::string buffer;
            thisSym->getHierarchicalPath(buffer);
            return buffer;
        });
    }

    ASSERT(deferredMemberIndex != DeferredMemberIndex::Invalid);
    auto deferredData = compilation.getOrAddDeferredData(deferredMemberIndex);
    deferredMemberIndex = DeferredMemberIndex::Invalid;

    SmallSet<const SyntaxNode*, 8> enumDecls;
    for (const auto& pair : deferredData.getTransparentTypes()) {
        auto insertAt = pair.first;
        auto dt = pair.second->getDeclaredType();

        const Type* type = &dt->getType();
        while (type->isPackedArray())
            type = type->getArrayElementType();

        if (type->kind == SymbolKind::EnumType) {
            if (!type->getSyntax() || enumDecls.insert(type->getSyntax()).second) {
                for (const auto& value : type->as<EnumType>().values()) {
                    auto wrapped = compilation.emplace<TransparentMemberSymbol>(value);
                    insertMember(wrapped, insertAt, true, false);
                    insertAt = wrapped;
                }
            }
        }
        else {
            // If there was an error with the enum definition, we still want to
            // add all of the members into this scope so that we don't get
            // further errors reported.
            auto syntax = dt->getTypeSyntax();
            ASSERT(syntax);
            ASSERT(type->kind == SymbolKind::ErrorType);

            SmallVector<const Symbol*> members;
            ASTContext context(*this, LookupLocation::max);
            EnumType::createDefaultMembers(context, syntax->as<EnumTypeSyntax>(), members);

            for (auto member : members) {
                insertMember(member, insertAt, true, false);
                insertAt = member;
            }
        }
    }

    auto deferred = deferredData.getMembers();

    if (thisSym->kind == SymbolKind::ClassType) {
        // If this is a class type being elaborated, let it inherit members from parent classes.
        thisSym->as<ClassType>().inheritMembers(
            [this](const Symbol& member) { insertMember(&member, nullptr, true, true); });
    }
    else if (thisSym->kind == SymbolKind::InstanceBody &&
             thisSym->as<InstanceBodySymbol>().getDefinition().definitionKind ==
                 DefinitionKind::Interface) {
        // Allow the interface to implicitly declare extern methods for
        // exported subroutines that are only declared in modports.
        handleExportedMethods(deferred);
    }

    auto insertMembers = [this](auto& members, const Symbol* at) {
        // When we originally inserted the DeferredMemberSymbol we made room
        // in the index space for these new members. Back the index up by
        // the number of new members to make sure we insert in order.
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size();
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    auto insertMembersAndNets = [this](auto& members, auto& implicitNets, const Symbol* at) {
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size() + 1;
        for (auto net : implicitNets) {
            insertMember(net, at, true, false);
            at = net;
        }

        at->indexInScope += 1;
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    // Go through deferred instances and elaborate them now.
    bool usedPorts = false;
    bool hasNestedDefs = false;
    uint32_t constructIndex = 1;

    for (auto symbol : deferred) {
        ASTContext context(*this, LookupLocation::before(*symbol));
        auto& member = symbol->as<DeferredMemberSymbol>();

        switch (member.node.kind) {
            case SyntaxKind::HierarchyInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                InstanceSymbol::fromSyntax(compilation,
                                           member.node.as<HierarchyInstantiationSyntax>(), context,
                                           instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::PrimitiveInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                PrimitiveInstanceSymbol::fromSyntax(member.node.as<PrimitiveInstantiationSyntax>(),
                                                    context, instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::IfGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<IfGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::CaseGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<CaseGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::LoopGenerate:
                insertMember(&GenerateBlockArraySymbol::fromSyntax(
                                 compilation, member.node.as<LoopGenerateSyntax>(),
                                 symbol->getIndex(), context, constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::GenerateBlock:
                // This case is invalid according to the spec but the parser only issues a warning
                // since some existing code does this anyway.
                insertMember(&GenerateBlockSymbol::fromSyntax(
                                 *this, member.node.as<GenerateBlockSyntax>(), constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::AnsiPortList:
            case SyntaxKind::NonAnsiPortList: {
                SmallVector<const Symbol*> ports;
                SmallVector<std::pair<Symbol*, const Symbol*>, 4> implicitMembers;
                PortSymbol::fromSyntax(member.node.as<PortListSyntax>(), *this, ports,
                                       implicitMembers, deferredData.getPortDeclarations());
                insertMembers(ports, symbol);

                for (auto [implicitMember, insertionPoint] : implicitMembers)
                    insertMember(implicitMember, insertionPoint, true, false);

                // Let the instance know its list of ports. This is kind of annoying because it
                // inverts the dependency tree but it's better than giving all symbols a virtual
                // method just for this.
                asSymbol().as<InstanceBodySymbol>().setPorts(ports.copy(compilation));
                usedPorts = true;
                break;
            }
            case SyntaxKind::ContinuousAssign: {
                SmallVector<const Symbol*> symbols;
                SmallVector<const Symbol*> implicitNets;
                ContinuousAssignSymbol::fromSyntax(compilation,
                                                   member.node.as<ContinuousAssignSyntax>(),
                                                   context, symbols, implicitNets);
                insertMembersAndNets(symbols, implicitNets, symbol);
                break;
            }
            case SyntaxKind::ModportDeclaration: {
                SmallVector<const ModportSymbol*> results;
                ModportSymbol::fromSyntax(context, member.node.as<ModportDeclarationSyntax>(),
                                          results);
                insertMembers(results, symbol);
                break;
            }
            case SyntaxKind::BindDirective:
                InstanceSymbol::fromBindDirective(*this, member.node.as<BindDirectiveSyntax>());
                break;
            case SyntaxKind::ClockingItem: {
                SmallVector<const ClockVarSymbol*> vars;
                ClockVarSymbol::fromSyntax(*this, member.node.as<ClockingItemSyntax>(), vars);
                insertMembers(vars, symbol);
                break;
            }
            case SyntaxKind::DefaultClockingReference: {
                // No symbol to create here; instead, try to look up the clocking block
                // and register it as a default.
                compilation.noteDefaultClocking(context,
                                                member.node.as<DefaultClockingReferenceSyntax>());
                break;
            }
            case SyntaxKind::DefaultDisableDeclaration: {
                // No symbol to create here; instead, bind the expression and hand it
                // off to the compilation for tracking.
                auto& expr = Expression::bind(
                    *member.node.as<DefaultDisableDeclarationSyntax>().expr, context);

                if (!expr.type->isVoid())
                    context.requireBooleanConvertible(expr);

                compilation.noteDefaultDisable(*this, expr);
                break;
            }
            case SyntaxKind::PortDeclaration:
                // Nothing to do here, handled by port creation.
                break;
            case SyntaxKind::DataDeclaration: {
                SmallVector<const Symbol*> instances;
                tryFixupInstances(member.node.as<DataDeclarationSyntax>(), context, instances);
                insertMembers(instances, symbol);
                break;
            }
            case SyntaxKind::ModuleDeclaration:
            case SyntaxKind::ProgramDeclaration:
                // These have to wait until we've seen all instantiations.
                hasNestedDefs = true;
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    // If there are nested definitions, go back through and find ones that
    // need to be implicitly instantiated.
    if (hasNestedDefs) {
        for (auto symbol : deferred) {
            auto& member = symbol->as<DeferredMemberSymbol>();
            if (member.node.kind == SyntaxKind::ModuleDeclaration ||
                member.node.kind == SyntaxKind::ProgramDeclaration) {
                handleNestedDefinition(member.node.as<ModuleDeclarationSyntax>());
            }
        }
    }

    // Issue an error if port I/Os were declared but the module doesn't have a port list.
    if (!usedPorts) {
        for (auto [syntax, symbol] : deferredData.getPortDeclarations()) {
            auto& declarators = syntax->kind == SyntaxKind::PortDeclaration
                                    ? syntax->as<PortDeclarationSyntax>().declarators
                                    : syntax->as<DataDeclarationSyntax>().declarators;
            for (auto decl : declarators) {
                // We'll report an error for just the first decl in each syntax entry,
                // because it should be clear to the user that there aren't any ports
                // at all in the module header.
                auto name = decl->name.valueText();
                if (!name.empty()) {
                    addDiag(diag::UnusedPortDecl, decl->sourceRange()) << name;
                    break;
                }
            }
        }
    }

    // Finally unlink any deferred members we had; we no longer need them.
    if (!deferred.empty()) {
        const Symbol* symbol = firstMember;
        const Symbol* prev = nullptr;

        while (symbol) {
            if (symbol->kind == SymbolKind::DeferredMember) {
                if (prev)
                    prev->nextInScope = symbol->nextInScope;
                else
                    firstMember = symbol->nextInScope;

                if (lastMember == symbol)
                    lastMember = symbol->nextInScope;
            }
            else {
                prev = symbol;
            }
            symbol = symbol->nextInScope;
        }
    }

    SmallSet<string_view, 4> observedForwardDecls;
    for (auto symbol : deferredData.getForwardingTypedefs()) {
        // Ignore duplicate entries.
        if (symbol->name.empty() || !observedForwardDecls.emplace(symbol->name).second)
            continue;

        // Try to do a lookup by name; if the program is well-formed we'll find the
        // corresponding full typedef. If we don't, issue an error.
        auto it = nameMap->find(symbol->name);
        ASSERT(it != nameMap->end());

        if (it->second->kind == SymbolKind::TypeAlias)
            it->second->as<TypeAliasType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::ClassType)
            it->second->as<ClassType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::GenericClassDef)
            it->second->as<GenericClassDefSymbol>().checkForwardDecls();
        else
            addDiag(diag::UnresolvedForwardTypedef, symbol->location) << symbol->name;
    }

    // Allow statement blocks containing variables to include them in their member
    // list before allowing anyone else to access the contained statements.
    if (thisSym->kind == SymbolKind::StatementBlock) {
        const Symbol* at = nullptr;
        thisSym->as<StatementBlockSymbol>().elaborateVariables([this, &at](const Symbol& member) {
            insertMember(&member, at, true, false);
            at = &member;
        });
    }

    ASSERT(deferredMemberIndex == DeferredMemberIndex::Invalid);
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled())
        TimeTrace::endTrace();
}